

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O0

int nni_listener_hold(nni_listener *l)

{
  int local_14;
  int rv;
  nni_listener *l_local;
  
  nni_mtx_lock(&listeners_lk);
  if ((l->l_closed & 1U) == 0) {
    l->l_ref = l->l_ref + 1;
    local_14 = 0;
  }
  else {
    local_14 = 7;
  }
  nni_mtx_unlock(&listeners_lk);
  return local_14;
}

Assistant:

int
nni_listener_hold(nni_listener *l)
{
	int rv;
	nni_mtx_lock(&listeners_lk);
	if (l->l_closed) {
		rv = NNG_ECLOSED;
	} else {
		l->l_ref++;
		rv = 0;
	}
	nni_mtx_unlock(&listeners_lk);
	return (rv);
}